

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O1

bool CheckChecksum(Span<const_char> *sp,bool require_checksum,string *error,string *out_checksum)

{
  size_t sVar1;
  pointer pSVar2;
  int iVar3;
  ulong uVar4;
  char *pcVar5;
  Span<const_char> *span;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  size_type __len2;
  bool bVar6;
  long in_FS_OFFSET;
  string_view separators;
  vector<Span<const_char>,_std::allocator<Span<const_char>_>_> check_split;
  string checksum;
  vector<Span<const_char>,_std::allocator<Span<const_char>_>_> local_a8;
  long *local_90 [2];
  long local_80 [2];
  string local_70;
  string local_50;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_50._M_dataplus._M_p._0_1_ = 0x23;
  separators._M_str = (char *)in_R8;
  separators._M_len = (size_t)&local_50;
  util::Split<Span<char_const>>(&local_a8,(util *)sp,(Span<const_char> *)0x1,separators);
  uVar4 = (long)local_a8.super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)local_a8.super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>.
                _M_impl.super__Vector_impl_data._M_start;
  if (uVar4 < 0x21) {
    if (!require_checksum || uVar4 != 0x10) {
      if ((uVar4 == 0x20) &&
         (local_a8.super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>._M_impl.
          super__Vector_impl_data._M_start[1].m_size != 8)) {
        local_70._M_dataplus._M_p =
             (pointer)local_a8.
                      super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>.
                      _M_impl.super__Vector_impl_data._M_start[1].m_size;
        tinyformat::format<unsigned_long>
                  (&local_50,"Expected 8 character checksum, not %u characters",
                   (unsigned_long *)&local_70);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (error,&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_50._M_dataplus._M_p._1_7_,local_50._M_dataplus._M_p._0_1_) !=
            &local_50.field_2) {
          operator_delete((undefined1 *)
                          CONCAT71(local_50._M_dataplus._M_p._1_7_,local_50._M_dataplus._M_p._0_1_),
                          local_50.field_2._M_allocated_capacity + 1);
        }
        bVar6 = false;
        goto LAB_0015a8fa;
      }
      (anonymous_namespace)::DescriptorChecksum_abi_cxx11_
                (&local_50,
                 (_anonymous_namespace_ *)
                 local_a8.super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>.
                 _M_impl.super__Vector_impl_data._M_start,span);
      pSVar2 = local_a8.super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if (local_50._M_string_length == 0) {
        bVar6 = false;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
                  (error,0,error->_M_string_length,"Invalid characters in payload",0x1d);
      }
      else {
        if ((long)local_a8.super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)local_a8.super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>.
                  _M_impl.super__Vector_impl_data._M_start == 0x20) {
          iVar3 = bcmp((void *)CONCAT71(local_50._M_dataplus._M_p._1_7_,
                                        local_50._M_dataplus._M_p._0_1_),
                       local_a8.
                       super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>.
                       _M_impl.super__Vector_impl_data._M_start[1].m_data,local_50._M_string_length)
          ;
          if (iVar3 != 0) {
            pcVar5 = pSVar2[1].m_data;
            local_90[0] = local_80;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_90,pcVar5,pcVar5 + pSVar2[1].m_size);
            tinyformat::format<std::__cxx11::string,std::__cxx11::string>
                      (&local_70,
                       (tinyformat *)
                       "Provided checksum \'%s\' does not match computed checksum \'%s\'",
                       (char *)local_90,&local_50,in_R8);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator=(error,&local_70);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70._M_dataplus._M_p != &local_70.field_2) {
              operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
            }
            if (local_90[0] != local_80) {
              operator_delete(local_90[0],local_80[0] + 1);
            }
            bVar6 = false;
            goto LAB_0015a9b8;
          }
        }
        if (out_checksum != (string *)0x0) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    (out_checksum,&local_50);
        }
        sVar1 = (local_a8.super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>.
                 _M_impl.super__Vector_impl_data._M_start)->m_size;
        sp->m_data = (local_a8.
                      super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>.
                      _M_impl.super__Vector_impl_data._M_start)->m_data;
        sp->m_size = sVar1;
        bVar6 = true;
      }
LAB_0015a9b8:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_50._M_dataplus._M_p._1_7_,local_50._M_dataplus._M_p._0_1_) !=
          &local_50.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_50._M_dataplus._M_p._1_7_,local_50._M_dataplus._M_p._0_1_),
                        local_50.field_2._M_allocated_capacity + 1);
      }
      goto LAB_0015a8fa;
    }
    __len2 = 0x10;
    pcVar5 = "Missing checksum";
  }
  else {
    __len2 = 0x14;
    pcVar5 = "Multiple \'#\' symbols";
  }
  bVar6 = false;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (error,0,error->_M_string_length,pcVar5,__len2);
LAB_0015a8fa:
  if (local_a8.super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.
                    super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_a8.
                          super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8.
                          super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar6;
  }
  __stack_chk_fail();
}

Assistant:

bool CheckChecksum(Span<const char>& sp, bool require_checksum, std::string& error, std::string* out_checksum = nullptr)
{
    auto check_split = Split(sp, '#');
    if (check_split.size() > 2) {
        error = "Multiple '#' symbols";
        return false;
    }
    if (check_split.size() == 1 && require_checksum){
        error = "Missing checksum";
        return false;
    }
    if (check_split.size() == 2) {
        if (check_split[1].size() != 8) {
            error = strprintf("Expected 8 character checksum, not %u characters", check_split[1].size());
            return false;
        }
    }
    auto checksum = DescriptorChecksum(check_split[0]);
    if (checksum.empty()) {
        error = "Invalid characters in payload";
        return false;
    }
    if (check_split.size() == 2) {
        if (!std::equal(checksum.begin(), checksum.end(), check_split[1].begin())) {
            error = strprintf("Provided checksum '%s' does not match computed checksum '%s'", std::string(check_split[1].begin(), check_split[1].end()), checksum);
            return false;
        }
    }
    if (out_checksum) *out_checksum = std::move(checksum);
    sp = check_split[0];
    return true;
}